

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall r_exec::View::set_res(View *this,double value)

{
  double dVar1;
  byte bVar2;
  Atom *this_00;
  float fVar3;
  Atom local_1c [4];
  double local_18;
  double value_local;
  View *this_local;
  
  local_18 = value;
  value_local = (double)this;
  this_00 = r_code::View::code(&this->super_View,4);
  r_code::Atom::PlusInfinity();
  bVar2 = r_code::Atom::operator==(this_00,local_1c);
  r_code::Atom::~Atom(local_1c);
  dVar1 = local_18;
  if ((bVar2 & 1) == 0) {
    fVar3 = get_res(this);
    this->acc_res = (float)((double)this->acc_res + (dVar1 - (double)fVar3));
    this->res_changes = this->res_changes + 1;
  }
  return;
}

Assistant:

void View::set_res(double value)
{
    if (code(VIEW_RES) == Atom::PlusInfinity()) {
        return;
    }

    acc_res += value - get_res();
    ++res_changes;
}